

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dialer.c
# Opt level: O0

int nni_dialer_init(nni_dialer *d,nni_sock *s,nni_sp_tran *tran)

{
  void *pvVar1;
  void *dp;
  int rv;
  nni_sp_tran *tran_local;
  nni_sock *s_local;
  nni_dialer *d_local;
  
  d->d_closed = false;
  d->d_data = (void *)0x0;
  d->d_ref = 1;
  d->d_sock = s;
  d->d_tran = tran;
  d->d_inirtime = 10;
  d->d_maxrtime = 1000;
  d->d_currtime = d->d_inirtime;
  nni_atomic_flag_reset(&d->d_started);
  memcpy(d,tran->tran_dialer,0x58);
  (d->d_node).ln_next = (nni_list_node *)0x0;
  (d->d_node).ln_prev = (nni_list_node *)0x0;
  nni_list_init_offset(&d->d_pipes,0xa8);
  nni_mtx_init(&d->d_mtx);
  d->d_data = d + 1;
  pvVar1 = d->d_data;
  nni_aio_init(&d->d_con_aio,dialer_connect_cb,d);
  nni_aio_init(&d->d_tmo_aio,dialer_timer_cb,d);
  dialer_stats_init(d);
  dp._4_4_ = (*(d->d_ops).d_init)(pvVar1,&d->d_url,d);
  if (dp._4_4_ == 0) {
    dp._4_4_ = nni_sock_add_dialer(s,d);
  }
  if (dp._4_4_ == 0) {
    nni_mtx_lock(&dialers_lk);
    dp._4_4_ = nni_id_alloc32(&dialers,&d->d_id,d);
    nni_mtx_unlock(&dialers_lk);
  }
  if (dp._4_4_ == 0) {
    dialer_register_stats(d);
  }
  return dp._4_4_;
}

Assistant:

static int
nni_dialer_init(nni_dialer *d, nni_sock *s, nni_sp_tran *tran)
{
	int   rv;
	void *dp;

	d->d_closed   = false;
	d->d_data     = NULL;
	d->d_ref      = 1;
	d->d_sock     = s;
	d->d_tran     = tran;
	d->d_inirtime = NNI_SECOND / 100; // 10ms
	d->d_maxrtime = NNI_SECOND;
	d->d_currtime = d->d_inirtime;
	nni_atomic_flag_reset(&d->d_started);

	// Make a copy of the endpoint operations.  This allows us to
	// modify them (to override NULLs for example), and avoids an extra
	// dereference on hot paths.
	d->d_ops = *tran->tran_dialer;

	NNI_LIST_NODE_INIT(&d->d_node);
	NNI_LIST_INIT(&d->d_pipes, nni_pipe, p_ep_node);

	nni_mtx_init(&d->d_mtx);

	d->d_data = ((uint8_t *) d) + NNI_ALIGN_UP(sizeof(*d));
	dp        = d->d_data;

	nni_aio_init(&d->d_con_aio, dialer_connect_cb, d);
	nni_aio_init(&d->d_tmo_aio, dialer_timer_cb, d);

	dialer_stats_init(d);

	rv = d->d_ops.d_init(dp, &d->d_url, d);

	if (rv == 0) {
		rv = nni_sock_add_dialer(s, d);
	}

	if (rv == 0) {
		nni_mtx_lock(&dialers_lk);
		rv = nni_id_alloc32(&dialers, &d->d_id, d);
		nni_mtx_unlock(&dialers_lk);
	}

	if (rv == 0) {
		dialer_register_stats(d);
	}

	return (rv);
}